

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O1

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::circleTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,vec3 normal,float radius)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  float fVar11;
  float in_XMM2_Dd;
  undefined1 auVar12 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar13;
  float in_XMM6_Dd;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  
  aVar13 = center.field_2;
  auVar12._8_56_ = center._8_56_;
  auVar12._0_8_ = center._0_8_;
  auVar10._8_56_ = raySource._8_56_;
  auVar10._0_8_ = raySource._0_8_;
  auVar17._0_4_ = rayDir.field_0.x * normal.field_0.x;
  auVar17._4_4_ = rayDir.field_1.y * normal.field_1.y;
  auVar17._8_4_ = 0;
  auVar17._12_4_ = in_XMM2_Dd * in_XMM6_Dd;
  auVar5 = vhaddps_avx(auVar17,auVar17);
  fVar16 = rayDir.field_2.z * normal.field_2.z + auVar5._0_4_;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(ZEXT416((uint)fVar16),auVar5);
  if (1e-06 <= auVar5._0_4_) {
    auVar5 = vsubps_avx(auVar12._0_16_,auVar10._0_16_);
    auVar14._0_4_ = auVar5._0_4_ * normal.field_0.x;
    auVar14._4_4_ = auVar5._4_4_ * normal.field_1.y;
    auVar14._8_4_ = auVar5._8_4_ * 0.0;
    auVar14._12_4_ = auVar5._12_4_ * in_XMM6_Dd;
    auVar5 = vhaddps_avx(auVar14,auVar14);
    fVar16 = (auVar5._0_4_ + (aVar13.z - raySource.field_2.z) * normal.field_2.z) / fVar16;
    fVar15 = 0.0;
    if (0.0 <= fVar16) {
      fVar2 = (fVar16 * rayDir.field_2.z + raySource.field_2.z) - aVar13.z;
      auVar6._0_4_ = fVar16 * rayDir.field_0.x + raySource.field_0.x;
      auVar6._4_4_ = fVar16 * rayDir.field_1.y + raySource.field_1.y;
      auVar6._8_4_ = fVar16 * 0.0 + raySource.field_2;
      auVar6._12_4_ = fVar16 * in_XMM2_Dd + raySource._12_4_;
      auVar17 = vsubps_avx(auVar6,auVar12._0_16_);
      auVar7._0_4_ = auVar17._0_4_ * auVar17._0_4_;
      auVar7._4_4_ = auVar17._4_4_ * auVar17._4_4_;
      auVar7._8_4_ = auVar17._8_4_ * auVar17._8_4_;
      auVar7._12_4_ = auVar17._12_4_ * auVar17._12_4_;
      auVar5 = vhaddps_avx(auVar7,auVar7);
      fVar15 = fVar2 * fVar2 + auVar5._0_4_;
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        auVar5 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
        fVar15 = auVar5._0_4_;
      }
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar5 = vandps_avx512vl(ZEXT416((uint)(fVar15 - radius)),auVar3);
      fVar11 = auVar5._0_4_;
      auVar8._4_4_ = fVar15;
      auVar8._0_4_ = fVar15;
      auVar8._8_4_ = fVar15;
      auVar8._12_4_ = fVar15;
      auVar5 = vdivps_avx(auVar17,auVar8);
      auVar9._0_4_ = auVar5._0_4_ * radius + center.field_0.x;
      auVar9._4_4_ = auVar5._4_4_ * radius + center.field_1.y;
      auVar9._8_4_ = auVar5._8_4_ * radius + center.field_2;
      auVar9._12_4_ = auVar5._12_4_ * radius + center._12_4_;
      fVar15 = radius * (fVar2 / fVar15) + aVar13.z;
      uVar1 = vmovlps_avx(auVar9);
      p_Var4 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var4->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var4->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
    }
    else {
      p_Var4 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var4->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      (p_Var4->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
      fVar16 = -1.0;
      fVar11 = INFINITY;
    }
  }
  else {
    p_Var4 = &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
              super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
    (p_Var4->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (p_Var4->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    fVar16 = -1.0;
    fVar11 = INFINITY;
    fVar15 = 0.0;
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
       fVar15;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<1UL,_float,_false>._M_head_impl = fVar11;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = fVar16;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::circleTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                    glm::vec3 center, glm::vec3 normal, float radius) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  // Intersect the ray with the plane defined by the normal
  float div = glm::dot(normal, rayDir);
  if (std::fabs(div) < 1e-6)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // parallel

  float tRay = glm::dot((center - raySource), normal) / div;
  if (tRay < 0) return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // behind the ray

  glm::vec3 hitPoint = raySource + tRay * rayDir;

  // Find the closest point on the circle
  float hitRad = glm::length(hitPoint - center);
  float ringDist = std::fabs(hitRad - radius);
  glm::vec3 nearestPoint = center + (hitPoint - center) / hitRad * radius;

  return ret_t{tRay, ringDist, nearestPoint};
}